

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::PipelineCache>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *pPVar1;
  Deleter<vk::VkInstance_s_*> **ppDVar2;
  bool bVar3;
  int iVar4;
  VkAllocationCallbacks *pVVar5;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  Environment rootEnv;
  AllocationCallbackRecorder objCallbacks;
  AllocationCallbackRecorder resCallbacks;
  VkPipelineCacheCreateInfo local_858;
  VkPipelineCache local_828;
  Deleter<vk::Handle<(vk::HandleType)15>_> DStack_820;
  Environment local_800;
  Move<vk::Handle<(vk::HandleType)15>_> local_7c8;
  AllocationCallbackRecorder local_7a8;
  AllocationCallbackRecorder local_748;
  EnvClone local_6e8;
  
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_748,pVVar5,0x80);
  pPVar1 = context->m_platformInterface;
  pDVar6 = Context::getDeviceInterface(context);
  pVVar7 = Context::getDevice(context);
  local_800.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_800.programBinaries = context->m_progCollection;
  local_800.allocationCallbacks =
       &local_748.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_800.maxResourceConsumers = 1;
  local_800.vkp = pPVar1;
  local_800.vkd = pDVar6;
  local_800.device = pVVar7;
  iVar4 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_7a8.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)((ulong)(iVar4 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_6e8,&local_800,(Parameters *)&local_7a8,iVar4 - 1U);
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_7a8,pVVar5,0x80);
  local_858.pNext = (void *)0x0;
  local_858._16_8_ = 0;
  local_858.initialDataSize = 0;
  local_858.pInitialData = (void *)0x0;
  local_858._0_8_ = (void *)0x11;
  ::vk::createPipelineCache
            (&local_7c8,local_6e8.env.vkd,local_6e8.env.device,&local_858,
             &local_7a8.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
  local_828.m_internal =
       local_7c8.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
  DStack_820.m_deviceIface =
       local_7c8.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
  DStack_820.m_device =
       local_7c8.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  DStack_820.m_allocator =
       local_7c8.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7a8,0x1e);
  if (bVar3) {
    if (local_828.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()(&DStack_820,local_828);
    }
    bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7a8,0);
    if (bVar3) {
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7a8);
      ::vk::DeviceDriver::~DeviceDriver(&local_6e8.vkd);
      if (local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_6e8.deviceRes.vki);
      if (local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_748,0);
      ppDVar2 = (Deleter<vk::VkInstance_s_*> **)
                &local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                 deleter;
      local_6e8.deviceRes.instance._0_8_ = ppDVar2;
      if (bVar3) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"Ok","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_6e8.deviceRes.instance._0_8_,
                   local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_6e8.deviceRes.instance._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6e8,"Invalid allocation callback","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_6e8.deviceRes.instance._0_8_,
                   local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_6e8.deviceRes.instance._0_8_);
      }
      if ((Deleter<vk::VkInstance_s_*> **)local_6e8.deviceRes.instance._0_8_ != ppDVar2) {
        operator_delete((void *)local_6e8.deviceRes.instance._0_8_,
                        (ulong)(local_6e8.deviceRes.instance.object.
                                super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance +
                               1));
      }
      goto LAB_003ef011;
    }
    local_858._0_8_ = (void *)((long)&local_858 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_858,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_858._0_8_,
               (long)local_858.pNext + local_858._0_8_);
    if ((void *)local_858._0_8_ != (void *)((long)&local_858 + 0x10U)) {
      operator_delete((void *)local_858._0_8_,local_858._16_8_ + 1);
    }
  }
  else {
    local_858._0_8_ = (void *)((long)&local_858 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_858,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_858._0_8_,
               (long)local_858.pNext + local_858._0_8_);
    if ((void *)local_858._0_8_ != (void *)((long)&local_858 + 0x10U)) {
      operator_delete((void *)local_858._0_8_,local_858._16_8_ + 1);
    }
    if (local_828.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()(&DStack_820,local_828);
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7a8);
  ::vk::DeviceDriver::~DeviceDriver(&local_6e8.vkd);
  if (local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_6e8.deviceRes.vki);
  if (local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
LAB_003ef011:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_748);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}